

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O1

string * __thiscall
CLI::Formatter::make_description_abi_cxx11_(string *__return_storage_ptr__,Formatter *this,App *app)

{
  pointer pcVar1;
  size_type sVar2;
  size_type *psVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  bool bVar5;
  uint uVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  ulong uVar9;
  ulong uVar10;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar11;
  ulong uVar12;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar13;
  uint uVar14;
  undefined8 uVar15;
  _Alloc_hider _Var16;
  string desc;
  string __str;
  size_type *local_130;
  size_type local_120;
  undefined8 uStack_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  string local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  pcVar1 = (app->description_)._M_dataplus._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_d0,pcVar1,pcVar1 + (app->description_)._M_string_length);
  uVar12 = app->require_option_min_;
  uVar10 = app->require_option_max_;
  if (app->required_ == true) {
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"REQUIRED","");
    FormatterBase::get_label(&local_f0,&this->super_FormatterBase,&local_50);
    pbVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             replace(&local_f0,0,0," ",1);
    local_110._M_dataplus._M_p = (pbVar7->_M_dataplus)._M_p;
    paVar8 = &pbVar7->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p == paVar8) {
      local_110.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
      local_110.field_2._8_8_ = *(undefined8 *)((long)&pbVar7->field_2 + 8);
      local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
    }
    else {
      local_110.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
    }
    local_110._M_string_length = pbVar7->_M_string_length;
    (pbVar7->_M_dataplus)._M_p = (pointer)paVar8;
    pbVar7->_M_string_length = 0;
    (pbVar7->field_2)._M_local_buf[0] = '\0';
    pbVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                       (&local_110," ");
    local_130 = (size_type *)(pbVar7->_M_dataplus)._M_p;
    paVar8 = &pbVar7->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130 == paVar8) {
      local_120 = paVar8->_M_allocated_capacity;
      uStack_118 = *(undefined8 *)((long)&pbVar7->field_2 + 8);
      local_130 = &local_120;
    }
    else {
      local_120 = paVar8->_M_allocated_capacity;
    }
    sVar2 = pbVar7->_M_string_length;
    (pbVar7->_M_dataplus)._M_p = (pointer)paVar8;
    pbVar7->_M_string_length = 0;
    (pbVar7->field_2)._M_local_buf[0] = '\0';
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
              (&local_d0,(char *)local_130,sVar2);
    if (local_130 != &local_120) {
      operator_delete(local_130,local_120 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != &local_110.field_2) {
      operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
  }
  if (uVar12 == 0 || uVar10 != uVar12) {
    if (uVar10 == 0) {
      if (uVar12 == 0) goto LAB_0018cf12;
      uVar14 = 1;
      if (9 < uVar12) {
        uVar10 = uVar12;
        uVar6 = 4;
        do {
          uVar14 = uVar6;
          if (uVar10 < 100) {
            uVar14 = uVar14 - 2;
            goto LAB_0018ccda;
          }
          if (uVar10 < 1000) {
            uVar14 = uVar14 - 1;
            goto LAB_0018ccda;
          }
          if (uVar10 < 10000) goto LAB_0018ccda;
          bVar5 = 99999 < uVar10;
          uVar10 = uVar10 / 10000;
          uVar6 = uVar14 + 4;
        } while (bVar5);
        uVar14 = uVar14 + 1;
      }
LAB_0018ccda:
      local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_construct
                (&local_f0,(ulong)uVar14,'\0');
      std::__detail::__to_chars_10_impl<unsigned_long>
                (local_f0._M_dataplus._M_p,(uint)local_f0._M_string_length,uVar12);
      pbVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               replace(&local_f0,0,0," \n[At least ",0xc);
      local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
      paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(pbVar7->_M_dataplus)._M_p;
      paVar11 = &pbVar7->field_2;
      if (paVar8 == paVar11) {
        local_110.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
        local_110.field_2._8_8_ = *(undefined8 *)((long)&pbVar7->field_2 + 8);
      }
      else {
        local_110.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
        local_110._M_dataplus._M_p = (pointer)paVar8;
      }
      local_110._M_string_length = pbVar7->_M_string_length;
      (pbVar7->_M_dataplus)._M_p = (pointer)paVar11;
      pbVar7->_M_string_length = 0;
      (pbVar7->field_2)._M_local_buf[0] = '\0';
      pbVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               append(&local_110," of the following options are required]");
      local_130 = &local_120;
      psVar3 = (size_type *)(pbVar7->_M_dataplus)._M_p;
      paVar8 = &pbVar7->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar3 == paVar8) {
        local_120 = paVar8->_M_allocated_capacity;
        uStack_118 = *(undefined8 *)((long)&pbVar7->field_2 + 8);
      }
      else {
        local_120 = paVar8->_M_allocated_capacity;
        local_130 = psVar3;
      }
      sVar2 = pbVar7->_M_string_length;
      (pbVar7->_M_dataplus)._M_p = (pointer)paVar8;
      pbVar7->_M_string_length = 0;
      (pbVar7->field_2)._M_local_buf[0] = '\0';
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                (&local_d0,(char *)local_130,sVar2);
      goto LAB_0018cecd;
    }
    uVar14 = 1;
    if (uVar12 == 0) {
      if (9 < uVar10) {
        uVar12 = uVar10;
        uVar6 = 4;
        do {
          uVar14 = uVar6;
          if (uVar12 < 100) {
            uVar14 = uVar14 - 2;
            goto LAB_0018cdd7;
          }
          if (uVar12 < 1000) {
            uVar14 = uVar14 - 1;
            goto LAB_0018cdd7;
          }
          if (uVar12 < 10000) goto LAB_0018cdd7;
          bVar5 = 99999 < uVar12;
          uVar12 = uVar12 / 10000;
          uVar6 = uVar14 + 4;
        } while (bVar5);
        uVar14 = uVar14 + 1;
      }
LAB_0018cdd7:
      local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_construct
                (&local_f0,(ulong)uVar14,'\0');
      std::__detail::__to_chars_10_impl<unsigned_long>
                (local_f0._M_dataplus._M_p,(uint)local_f0._M_string_length,uVar10);
      pbVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               replace(&local_f0,0,0," \n[At most ",0xb);
      local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
      paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(pbVar7->_M_dataplus)._M_p;
      paVar11 = &pbVar7->field_2;
      if (paVar8 == paVar11) {
        local_110.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
        local_110.field_2._8_8_ = *(undefined8 *)((long)&pbVar7->field_2 + 8);
      }
      else {
        local_110.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
        local_110._M_dataplus._M_p = (pointer)paVar8;
      }
      local_110._M_string_length = pbVar7->_M_string_length;
      (pbVar7->_M_dataplus)._M_p = (pointer)paVar11;
      pbVar7->_M_string_length = 0;
      (pbVar7->field_2)._M_local_buf[0] = '\0';
      pbVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               append(&local_110," of the following options are allowed]");
      local_130 = &local_120;
      psVar3 = (size_type *)(pbVar7->_M_dataplus)._M_p;
      paVar8 = &pbVar7->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar3 == paVar8) {
        local_120 = paVar8->_M_allocated_capacity;
        uStack_118 = *(undefined8 *)((long)&pbVar7->field_2 + 8);
      }
      else {
        local_120 = paVar8->_M_allocated_capacity;
        local_130 = psVar3;
      }
      sVar2 = pbVar7->_M_string_length;
      (pbVar7->_M_dataplus)._M_p = (pointer)paVar8;
      pbVar7->_M_string_length = 0;
      (pbVar7->field_2)._M_local_buf[0] = '\0';
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                (&local_d0,(char *)local_130,sVar2);
      goto LAB_0018cecd;
    }
    if (9 < uVar12) {
      uVar9 = uVar12;
      uVar6 = 4;
      do {
        uVar14 = uVar6;
        if (uVar9 < 100) {
          uVar14 = uVar14 - 2;
          goto LAB_0018c97e;
        }
        if (uVar9 < 1000) {
          uVar14 = uVar14 - 1;
          goto LAB_0018c97e;
        }
        if (uVar9 < 10000) goto LAB_0018c97e;
        bVar5 = 99999 < uVar9;
        uVar9 = uVar9 / 10000;
        uVar6 = uVar14 + 4;
      } while (bVar5);
      uVar14 = uVar14 + 1;
    }
LAB_0018c97e:
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_construct
              (&local_70,(ulong)uVar14,'\0');
    std::__detail::__to_chars_10_impl<unsigned_long>
              (local_70._M_dataplus._M_p,(uint)local_70._M_string_length,uVar12);
    pbVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             replace(&local_70,0,0," \n[Between ",0xb);
    local_90._M_dataplus._M_p = (pbVar7->_M_dataplus)._M_p;
    paVar8 = &pbVar7->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p == paVar8) {
      local_90.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
      local_90.field_2._8_8_ = *(undefined8 *)((long)&pbVar7->field_2 + 8);
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    }
    else {
      local_90.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
    }
    local_90._M_string_length = pbVar7->_M_string_length;
    (pbVar7->_M_dataplus)._M_p = (pointer)paVar8;
    pbVar7->_M_string_length = 0;
    (pbVar7->field_2)._M_local_buf[0] = '\0';
    pbVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                       (&local_90," and ");
    paVar8 = &local_f0.field_2;
    local_f0._M_dataplus._M_p = (pbVar7->_M_dataplus)._M_p;
    paVar11 = &pbVar7->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p == paVar11) {
      local_f0.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
      local_f0.field_2._8_8_ = *(undefined8 *)((long)&pbVar7->field_2 + 8);
      local_f0._M_dataplus._M_p = (pointer)paVar8;
    }
    else {
      local_f0.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
    }
    local_f0._M_string_length = pbVar7->_M_string_length;
    (pbVar7->_M_dataplus)._M_p = (pointer)paVar11;
    pbVar7->_M_string_length = 0;
    (pbVar7->field_2)._M_local_buf[0] = '\0';
    uVar14 = 1;
    if (9 < uVar10) {
      uVar12 = uVar10;
      uVar6 = 4;
      do {
        uVar14 = uVar6;
        if (uVar12 < 100) {
          uVar14 = uVar14 - 2;
          goto LAB_0018cad1;
        }
        if (uVar12 < 1000) {
          uVar14 = uVar14 - 1;
          goto LAB_0018cad1;
        }
        if (uVar12 < 10000) goto LAB_0018cad1;
        bVar5 = 99999 < uVar12;
        uVar12 = uVar12 / 10000;
        uVar6 = uVar14 + 4;
      } while (bVar5);
      uVar14 = uVar14 + 1;
    }
LAB_0018cad1:
    paVar11 = &local_b0.field_2;
    local_b0._M_dataplus._M_p = (pointer)paVar11;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_construct
              (&local_b0,(ulong)uVar14,'\0');
    std::__detail::__to_chars_10_impl<unsigned_long>
              (local_b0._M_dataplus._M_p,(uint)local_b0._M_string_length,uVar10);
    uVar12 = CONCAT44(local_b0._M_string_length._4_4_,(uint)local_b0._M_string_length) +
             local_f0._M_string_length;
    uVar15 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != paVar8) {
      uVar15 = local_f0.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar15 < uVar12) {
      uVar15 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != paVar11) {
        uVar15 = local_b0.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar15 < uVar12) goto LAB_0018cb4b;
      pbVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               replace(&local_b0,0,0,local_f0._M_dataplus._M_p,local_f0._M_string_length);
    }
    else {
LAB_0018cb4b:
      pbVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               _M_append(&local_f0,local_b0._M_dataplus._M_p,
                         CONCAT44(local_b0._M_string_length._4_4_,(uint)local_b0._M_string_length));
    }
    local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
    paVar4 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(pbVar7->_M_dataplus)._M_p;
    paVar13 = &pbVar7->field_2;
    if (paVar4 == paVar13) {
      local_110.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
      local_110.field_2._8_8_ = *(undefined8 *)((long)&pbVar7->field_2 + 8);
    }
    else {
      local_110.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
      local_110._M_dataplus._M_p = (pointer)paVar4;
    }
    local_110._M_string_length = pbVar7->_M_string_length;
    (pbVar7->_M_dataplus)._M_p = (pointer)paVar13;
    pbVar7->_M_string_length = 0;
    paVar13->_M_local_buf[0] = '\0';
    pbVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                       (&local_110," of the follow options are required]");
    local_130 = (size_type *)(pbVar7->_M_dataplus)._M_p;
    paVar13 = &pbVar7->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130 == paVar13) {
      local_120 = paVar13->_M_allocated_capacity;
      uStack_118 = *(undefined8 *)((long)&pbVar7->field_2 + 8);
      local_130 = &local_120;
    }
    else {
      local_120 = paVar13->_M_allocated_capacity;
    }
    sVar2 = pbVar7->_M_string_length;
    (pbVar7->_M_dataplus)._M_p = (pointer)paVar13;
    pbVar7->_M_string_length = 0;
    (pbVar7->field_2)._M_local_buf[0] = '\0';
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
              (&local_d0,(char *)local_130,sVar2);
    if (local_130 != &local_120) {
      operator_delete(local_130,local_120 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != &local_110.field_2) {
      operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != paVar11) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != paVar8) {
      operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
    _Var16._M_p = local_70._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p == &local_70.field_2) goto LAB_0018cf12;
  }
  else {
    if (uVar12 == 1) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (&local_d0," \n[Exactly 1 of the following options is required]");
      goto LAB_0018cf12;
    }
    uVar14 = 1;
    if (9 < uVar12) {
      uVar10 = uVar12;
      uVar6 = 4;
      do {
        uVar14 = uVar6;
        if (uVar10 < 100) {
          uVar14 = uVar14 - 2;
          goto LAB_0018c87c;
        }
        if (uVar10 < 1000) {
          uVar14 = uVar14 - 1;
          goto LAB_0018c87c;
        }
        if (uVar10 < 10000) goto LAB_0018c87c;
        bVar5 = 99999 < uVar10;
        uVar10 = uVar10 / 10000;
        uVar6 = uVar14 + 4;
      } while (bVar5);
      uVar14 = uVar14 + 1;
    }
LAB_0018c87c:
    local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_construct
              (&local_f0,(ulong)uVar14,'\0');
    std::__detail::__to_chars_10_impl<unsigned_long>
              (local_f0._M_dataplus._M_p,(uint)local_f0._M_string_length,uVar12);
    pbVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             replace(&local_f0,0,0," \n[Exactly ",0xb);
    local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
    paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(pbVar7->_M_dataplus)._M_p;
    paVar11 = &pbVar7->field_2;
    if (paVar8 == paVar11) {
      local_110.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
      local_110.field_2._8_8_ = *(undefined8 *)((long)&pbVar7->field_2 + 8);
    }
    else {
      local_110.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
      local_110._M_dataplus._M_p = (pointer)paVar8;
    }
    local_110._M_string_length = pbVar7->_M_string_length;
    (pbVar7->_M_dataplus)._M_p = (pointer)paVar11;
    pbVar7->_M_string_length = 0;
    (pbVar7->field_2)._M_local_buf[0] = '\0';
    pbVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                       (&local_110," options from the following list are required]");
    local_130 = &local_120;
    psVar3 = (size_type *)(pbVar7->_M_dataplus)._M_p;
    paVar8 = &pbVar7->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar3 == paVar8) {
      local_120 = paVar8->_M_allocated_capacity;
      uStack_118 = *(undefined8 *)((long)&pbVar7->field_2 + 8);
    }
    else {
      local_120 = paVar8->_M_allocated_capacity;
      local_130 = psVar3;
    }
    sVar2 = pbVar7->_M_string_length;
    (pbVar7->_M_dataplus)._M_p = (pointer)paVar8;
    pbVar7->_M_string_length = 0;
    (pbVar7->field_2)._M_local_buf[0] = '\0';
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
              (&local_d0,(char *)local_130,sVar2);
LAB_0018cecd:
    if (local_130 != &local_120) {
      operator_delete(local_130,local_120 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != &local_110.field_2) {
      operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
    }
    local_70.field_2._M_allocated_capacity = local_f0.field_2._M_allocated_capacity;
    _Var16._M_p = local_f0._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p == &local_f0.field_2) goto LAB_0018cf12;
  }
  operator_delete(_Var16._M_p,local_70.field_2._M_allocated_capacity + 1);
LAB_0018cf12:
  if (local_d0._M_string_length == 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,local_d0._M_dataplus._M_p,
               local_d0._M_dataplus._M_p + local_d0._M_string_length);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (__return_storage_ptr__,"\n");
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

CLI11_INLINE std::string Formatter::make_description(const App *app) const {
    std::string desc = app->get_description();
    auto min_options = app->get_require_option_min();
    auto max_options = app->get_require_option_max();
    if(app->get_required()) {
        desc += " " + get_label("REQUIRED") + " ";
    }
    if((max_options == min_options) && (min_options > 0)) {
        if(min_options == 1) {
            desc += " \n[Exactly 1 of the following options is required]";
        } else {
            desc += " \n[Exactly " + std::to_string(min_options) + " options from the following list are required]";
        }
    } else if(max_options > 0) {
        if(min_options > 0) {
            desc += " \n[Between " + std::to_string(min_options) + " and " + std::to_string(max_options) +
                    " of the follow options are required]";
        } else {
            desc += " \n[At most " + std::to_string(max_options) + " of the following options are allowed]";
        }
    } else if(min_options > 0) {
        desc += " \n[At least " + std::to_string(min_options) + " of the following options are required]";
    }
    return (!desc.empty()) ? desc + "\n" : std::string{};
}